

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_signer_scriptpubkeyman.cpp
# Opt level: O0

optional<common::PSBTError> __thiscall
wallet::ExternalSignerScriptPubKeyMan::FillPSBT
          (ExternalSignerScriptPubKeyMan *this,PartiallySignedTransaction *psbt,
          PrecomputedTransactionData *txdata,int sighash_type,bool sign,bool bip32derivs,
          int *n_signed,bool finalize)

{
  long lVar1;
  bool bVar2;
  undefined1 uVar3;
  byte bVar4;
  undefined4 in_ECX;
  PartiallySignedTransaction *in_RDI;
  byte in_R8B;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  bool bVar5;
  byte in_stack_00000010;
  bool in_stack_00000031;
  bool in_stack_00000032;
  bool in_stack_00000033;
  int in_stack_00000034;
  PrecomputedTransactionData *in_stack_00000038;
  PartiallySignedTransaction *in_stack_00000040;
  DescriptorScriptPubKeyMan *in_stack_00000048;
  PSBTInput *input;
  vector<PSBTInput,_std::allocator<PSBTInput>_> *__range1;
  bool complete;
  iterator __end1;
  iterator __begin1;
  string strFailReason;
  int *in_stack_000001e0;
  PSBTInput *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  __normal_iterator<PSBTInput_*,_std::vector<PSBTInput,_std::allocator<PSBTInput>_>_>
  *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  undefined6 in_stack_fffffffffffffed8;
  undefined8 local_b0;
  string *in_stack_ffffffffffffff78;
  PartiallySignedTransaction *in_stack_ffffffffffffff80;
  ExternalSigner *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_R8B & 1) == 0) {
    local_b0 = (_Optional_payload_base<common::PSBTError>)
               DescriptorScriptPubKeyMan::FillPSBT
                         (in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000034,
                          in_stack_00000033,in_stack_00000032,in_stack_000001e0,in_stack_00000031);
  }
  else {
    bVar5 = true;
    std::vector<PSBTInput,_std::allocator<PSBTInput>_>::begin
              ((vector<PSBTInput,_std::allocator<PSBTInput>_> *)
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    std::vector<PSBTInput,_std::allocator<PSBTInput>_>::end
              ((vector<PSBTInput,_std::allocator<PSBTInput>_> *)
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    while( true ) {
      bVar2 = __gnu_cxx::
              operator==<PSBTInput_*,_std::vector<PSBTInput,_std::allocator<PSBTInput>_>_>
                        (in_stack_fffffffffffffec8,
                         (__normal_iterator<PSBTInput_*,_std::vector<PSBTInput,_std::allocator<PSBTInput>_>_>
                          *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      __gnu_cxx::__normal_iterator<PSBTInput_*,_std::vector<PSBTInput,_std::allocator<PSBTInput>_>_>
      ::operator*((__normal_iterator<PSBTInput_*,_std::vector<PSBTInput,_std::allocator<PSBTInput>_>_>
                   *)in_stack_fffffffffffffeb8);
      bVar2 = PSBTInputSigned(in_stack_fffffffffffffeb8);
      bVar5 = (bVar5 & bVar2) != 0;
      __gnu_cxx::__normal_iterator<PSBTInput_*,_std::vector<PSBTInput,_std::allocator<PSBTInput>_>_>
      ::operator++((__normal_iterator<PSBTInput_*,_std::vector<PSBTInput,_std::allocator<PSBTInput>_>_>
                    *)in_stack_fffffffffffffeb8);
    }
    if (bVar5 == false) {
      std::__cxx11::string::string(in_stack_fffffffffffffed0);
      GetExternalSigner();
      uVar3 = ExternalSigner::SignTransaction
                        (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                         in_stack_ffffffffffffff78);
      bVar4 = uVar3 ^ 0xff;
      ExternalSigner::~ExternalSigner((ExternalSigner *)in_stack_fffffffffffffeb8);
      if ((bVar4 & 1) == 0) {
        if ((in_stack_00000010 & 1) != 0) {
          FinalizePSBT(in_RDI);
        }
        std::optional<common::PSBTError>::optional
                  ((optional<common::PSBTError> *)in_stack_fffffffffffffeb8);
      }
      else {
        tinyformat::format<std::__cxx11::string>
                  ((ostream *)CONCAT44(in_ECX,in_R9D),
                   (char *)CONCAT17(uVar3,CONCAT16(bVar4,in_stack_fffffffffffffed8)),
                   in_stack_fffffffffffffed0);
        std::optional<common::PSBTError>::optional<common::PSBTError,_true>
                  ((optional<common::PSBTError> *)in_stack_fffffffffffffec8,
                   (PSBTError *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      }
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffeb8);
    }
    else {
      std::optional<common::PSBTError>::optional
                ((optional<common::PSBTError> *)in_stack_fffffffffffffeb8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (optional<common::PSBTError>)local_b0;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<PSBTError> ExternalSignerScriptPubKeyMan::FillPSBT(PartiallySignedTransaction& psbt, const PrecomputedTransactionData& txdata, int sighash_type, bool sign, bool bip32derivs, int* n_signed, bool finalize) const
{
    if (!sign) {
        return DescriptorScriptPubKeyMan::FillPSBT(psbt, txdata, sighash_type, false, bip32derivs, n_signed, finalize);
    }

    // Already complete if every input is now signed
    bool complete = true;
    for (const auto& input : psbt.inputs) {
        // TODO: for multisig wallets, we should only care if all _our_ inputs are signed
        complete &= PSBTInputSigned(input);
    }
    if (complete) return {};

    std::string strFailReason;
    if(!GetExternalSigner().SignTransaction(psbt, strFailReason)) {
        tfm::format(std::cerr, "Failed to sign: %s\n", strFailReason);
        return PSBTError::EXTERNAL_SIGNER_FAILED;
    }
    if (finalize) FinalizePSBT(psbt); // This won't work in a multisig setup
    return {};
}